

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

void put16bitbwtile(TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
                   int32_t fromskew,int32_t toskew,uchar *pp)

{
  ushort uVar1;
  uint32_t **ppuVar2;
  uint32_t uVar3;
  
  if (h != 0) {
    ppuVar2 = img->BWmap;
    uVar1 = img->samplesperpixel;
    do {
      uVar3 = w;
      if (w != 0) {
        do {
          *cp = *ppuVar2[pp[1]];
          cp = cp + 1;
          pp = pp + (uint)uVar1 * 2;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      pp = pp + fromskew;
      cp = cp + toskew;
      h = h - 1;
    } while (h != 0);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(put16bitbwtile)
{
    int samplesperpixel = img->samplesperpixel;
    uint32_t **BWmap = img->BWmap;

    (void)y;
    for (; h > 0; --h)
    {
        uint16_t *wp = (uint16_t *)pp;

        for (x = w; x > 0; --x)
        {
            /* use high order byte of 16bit value */

            *cp++ = BWmap[*wp >> 8][0];
            pp += 2 * samplesperpixel;
            wp += samplesperpixel;
        }
        cp += toskew;
        pp += fromskew;
    }
}